

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FlattenLayerParams::SerializeWithCachedSizes
          (FlattenLayerParams *this,CodedOutputStream *output)

{
  FlattenLayerParams_FlattenOrder FVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FlattenLayerParams *this_local;
  
  FVar1 = mode(this);
  if (FVar1 != FlattenLayerParams_FlattenOrder_CHANNEL_FIRST) {
    FVar1 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,FVar1,output);
  }
  return;
}

Assistant:

void FlattenLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FlattenLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.FlattenLayerParams.FlattenOrder mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FlattenLayerParams)
}